

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Icosahedron.cpp
# Opt level: O0

vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> * __thiscall
OpenMD::Icosahedron::ih(Icosahedron *this,int n)

{
  bool bVar1;
  reference ppVar2;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_00;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var4;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var5;
  int in_EDX;
  long in_RSI;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_RDI;
  int k;
  Vector3d v2;
  Vector3d v1;
  int j_1;
  Vector3d e3;
  Vector3d e2_1;
  Vector3d e1_1;
  type *third;
  type *second;
  type *first;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *__range1;
  int j;
  Vector3d e2;
  Vector3d e1;
  iterator i_1;
  iterator i;
  Vector<double,_3U> *in_stack_fffffffffffffc18;
  Vector<double,_3U> *in_stack_fffffffffffffc20;
  Vector<double,_3U> *in_stack_fffffffffffffc28;
  Vector3<double> *in_stack_fffffffffffffc30;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_fffffffffffffc68;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_fffffffffffffc70;
  int local_324;
  int local_22c;
  __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
  local_170;
  long local_168;
  int local_e4;
  pair<int,_int> *local_80;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_78 [7];
  Vector3<double> *local_40;
  __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
  local_38 [4];
  int local_14;
  
  if (in_EDX < 0) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  }
  else if (in_EDX == 0) {
    Vector3<double>::Vector3
              (in_stack_fffffffffffffc30,(double)in_stack_fffffffffffffc28,
               (double)in_stack_fffffffffffffc20,(double)in_stack_fffffffffffffc18);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  }
  else {
    local_14 = in_EDX;
    local_38[0]._M_current =
         (Vector3<double> *)
         std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::begin
                   ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                    in_stack_fffffffffffffc18);
    while( true ) {
      local_40 = (Vector3<double> *)
                 std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                 end((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     in_stack_fffffffffffffc18);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                          *)in_stack_fffffffffffffc20,
                         (__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                          *)in_stack_fffffffffffffc18);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
      ::operator*(local_38);
      OpenMD::operator*(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
      Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
      __gnu_cxx::
      __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
      ::operator++(local_38);
    }
    if (local_14 < 2) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    }
    else {
      local_78[0]._M_current =
           (pair<int,_int> *)
           std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      in_stack_fffffffffffffc18);
      while( true ) {
        local_80 = (pair<int,_int> *)
                   std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                             ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              in_stack_fffffffffffffc18);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                            *)in_stack_fffffffffffffc20,
                           (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                            *)in_stack_fffffffffffffc18);
        if (!bVar1) break;
        in_stack_fffffffffffffc28 = (Vector<double,_3U> *)(in_RSI + 0x50);
        ppVar2 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(local_78);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   in_stack_fffffffffffffc28,(long)ppVar2->first);
        OpenMD::operator*(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
        Vector3<double>::Vector3
                  ((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        this_00 = (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                  (in_RSI + 0x50);
        ppVar2 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(local_78);
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (this_00,(long)ppVar2->second);
        OpenMD::operator*(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
        Vector3<double>::Vector3
                  ((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        for (local_e4 = 1; local_e4 <= local_14 + -1; local_e4 = local_e4 + 1) {
          in_stack_fffffffffffffc20 = (Vector<double,_3U> *)(in_RSI + 8);
          OpenMD::operator-(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
          OpenMD::operator*(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
          operator/(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
          OpenMD::operator+(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
                    ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(local_78);
      }
      if (local_14 < 3) {
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                  (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      }
      else {
        local_168 = in_RSI + 0x38;
        local_170._M_current =
             (tuple<int,_int,_int> *)
             std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::
             begin((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *
                   )in_stack_fffffffffffffc18);
        std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::end
                  ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *
                   )in_stack_fffffffffffffc18);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
                              *)in_stack_fffffffffffffc20,
                             (__normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
                              *)in_stack_fffffffffffffc18);
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
          ::operator*(&local_170);
          p_Var3 = std::get<0ul,int,int,int>((tuple<int,_int,_int> *)0x2b62a5);
          p_Var4 = std::get<1ul,int,int,int>((tuple<int,_int,_int> *)0x2b62ba);
          p_Var5 = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)0x2b62cf);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     (in_RSI + 0x50),(long)*p_Var3);
          OpenMD::operator*(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     (in_RSI + 0x50),(long)*p_Var4);
          OpenMD::operator*(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     (in_RSI + 0x50),(long)*p_Var5);
          OpenMD::operator*(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          for (local_22c = 1; local_22c <= local_14 + -2; local_22c = local_22c + 1) {
            OpenMD::operator-(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
            OpenMD::operator*(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
            operator/(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
            OpenMD::operator+(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
            Vector3<double>::Vector3
                      ((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
            OpenMD::operator-(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
            OpenMD::operator*(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
            operator/(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
            OpenMD::operator+(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
            Vector3<double>::Vector3
                      ((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
            for (local_324 = 1; local_324 <= local_22c; local_324 = local_324 + 1) {
              in_stack_fffffffffffffc18 = (Vector<double,_3U> *)(in_RSI + 8);
              OpenMD::operator-(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
              OpenMD::operator*(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
              operator/(in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
              OpenMD::operator+(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
              Vector3<double>::Vector3
                        ((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
              std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              push_back((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)in_stack_fffffffffffffc20,(value_type *)in_stack_fffffffffffffc18);
            }
          }
          __gnu_cxx::
          __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
          ::operator++(&local_170);
        }
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                  (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<Vector3d> Icosahedron::ih(int n) {
    if (n < 0) return Points;

    if (n == 0) {
      // center particle only

      Points.push_back(Vector3d(0.0, 0.0, 0.0));
      return Points;
    }

    //
    // Generate edge particles
    //
    for (std::vector<Vector3d>::iterator i = Basis.begin(); i != Basis.end();
         ++i) {
      Points.push_back((*i) * RealType(n));
    }

    //
    // Generate side particles
    //
    if (n < 2) return Points;

    for (std::vector<std::pair<int, int>>::iterator i = Edges.begin();
         i != Edges.end(); ++i) {
      Vector3d e1 = Basis[(*i).first] * RealType(n);
      Vector3d e2 = Basis[(*i).second] * RealType(n);

      for (int j = 1; j <= n - 1; j++) {
        Points.push_back(e1 + (e2 - e1) * RealType(j) / RealType(n));
      }
    }

    //
    // Generate body particles
    //
    if (n < 3) return Points;

    for (const auto& [first, second, third] : Facets) {
      Vector3d e1 = Basis[first] * RealType(n);
      Vector3d e2 = Basis[second] * RealType(n);
      Vector3d e3 = Basis[third] * RealType(n);

      for (int j = 1; j <= n - 2; j++) {
        Vector3d v1 = e1 + (e2 - e1) * RealType(j + 1) / RealType(n);
        Vector3d v2 = e1 + (e3 - e1) * RealType(j + 1) / RealType(n);

        for (int k = 1; k <= j; k++) {
          Points.push_back(v1 + (v2 - v1) * RealType(k) / RealType(j + 1));
        }
      }
    }

    return Points;
  }